

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

wchar_t bid_keyword_list(char *p,ssize_t len,wchar_t unset,wchar_t last_is_path)

{
  char cVar1;
  wchar_t wVar2;
  ulong uVar3;
  wchar_t wVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  byte bVar8;
  undefined8 *puVar9;
  
  if (len < 1) {
    wVar4 = L'\0';
  }
  else {
    wVar4 = L'\0';
    while (cVar7 = *p, cVar7 != '\0') {
      bVar8 = 0;
      pcVar6 = p;
      while( true ) {
        pcVar5 = pcVar6 + 1;
        if ((cVar7 != ' ') && (cVar7 != '\t')) goto LAB_006272f6;
        pcVar6 = pcVar5;
        if (len < 2) break;
        len = len + -1;
        cVar7 = *pcVar5;
        bVar8 = 1;
      }
      cVar7 = *pcVar5;
      bVar8 = 1;
      len = 0;
LAB_006272f6:
      cVar1 = cVar7;
      if (cVar7 == '\\') {
        cVar1 = pcVar6[1];
      }
      if (cVar1 == '\n') {
        return wVar4;
      }
      if (cVar1 == '\r') {
        return wVar4;
      }
      if ((bool)(last_is_path == L'\0' & (bVar8 ^ 1))) {
        return L'\xffffffff';
      }
      if ((last_is_path != L'\0') && (len == 0)) {
        return wVar4;
      }
      if ((unset != L'\0') && (wVar2 = bid_keycmp(pcVar6,"all",len), L'\0' < wVar2)) {
        return L'\x01';
      }
      bVar8 = cVar7 + 0x9d;
      if (0x12 < bVar8) {
        return L'\xffffffff';
      }
      if ((0x79e5bU >> (bVar8 & 0x1f) & 1) == 0) {
        return L'\xffffffff';
      }
      puVar9 = (undefined8 *)(&PTR_bid_keyword_keys_c_0095bac8)[bVar8];
      pcVar5 = (char *)*puVar9;
      while( true ) {
        if (pcVar5 == (char *)0x0) {
          return L'\xffffffff';
        }
        puVar9 = puVar9 + 1;
        wVar2 = bid_keycmp(pcVar6,pcVar5,len);
        if (L'\0' < wVar2) break;
        pcVar5 = (char *)*puVar9;
      }
      uVar3 = (ulong)(uint)wVar2;
      p = pcVar6 + uVar3;
      len = len - uVar3;
      wVar4 = wVar4 + L'\x01';
      if (pcVar6[uVar3] == '=') {
        p = p + 1;
        if (len < 2) {
          bVar8 = 0;
        }
        else {
          bVar8 = 0;
          while ((*p != ' ' && (*p != '\t'))) {
            p = p + 1;
            len = len + -1;
            bVar8 = 1;
            if (len < 2) {
              return wVar4;
            }
          }
        }
        len = len + -1;
        if ((bool)(unset == L'\0' & (bVar8 ^ 1))) {
          return L'\xffffffff';
        }
      }
      if (len < 1) {
        return wVar4;
      }
    }
  }
  return wVar4;
}

Assistant:

static int
bid_keyword_list(const char *p,  ssize_t len, int unset, int last_is_path)
{
	int l;
	int keycnt = 0;

	while (len > 0 && *p) {
		int blank = 0;

		/* Test whether there are blank characters in the line. */
		while (len >0 && (*p == ' ' || *p == '\t')) {
			++p;
			--len;
			blank = 1;
		}
		if (*p == '\n' || *p == '\r')
			break;
		if (p[0] == '\\' && (p[1] == '\n' || p[1] == '\r'))
			break;
		if (!blank && !last_is_path) /* No blank character. */
			return (-1);
		if (last_is_path && len == 0)
				return (keycnt);

		if (unset) {
			l = bid_keycmp(p, "all", len);
			if (l > 0)
				return (1);
		}
		/* Test whether there is a correct key in the line. */
		l = bid_keyword(p, len);
		if (l == 0)
			return (-1);/* Unknown keyword was found. */
		p += l;
		len -= l;
		keycnt++;

		/* Skip value */
		if (*p == '=') {
			int value = 0;
			++p;
			--len;
			while (len > 0 && *p != ' ' && *p != '\t') {
				++p;
				--len;
				value = 1;
			}
			/* A keyword should have a its value unless
			 * "/unset" operation. */ 
			if (!unset && value == 0)
				return (-1);
		}
	}
	return (keycnt);
}